

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyDown(int user_key_index)

{
  uint in_EDI;
  ImGuiContext *g;
  bool local_11;
  bool local_1;
  
  if ((int)in_EDI < 0) {
    local_1 = false;
  }
  else {
    local_11 = 0x1ff < in_EDI;
    if (local_11) {
      __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1144,"bool ImGui::IsKeyDown(int)");
    }
    local_1 = (bool)((GImGui->IO).KeysDown[(int)in_EDI] & 1);
  }
  return local_1;
}

Assistant:

bool ImGui::IsKeyDown(int user_key_index)
{
    if (user_key_index < 0)
        return false;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    return g.IO.KeysDown[user_key_index];
}